

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

bool __thiscall
InstanceIsLessThanComparator::operator()
          (InstanceIsLessThanComparator *this,shared_ptr<Instance> *lhs,shared_ptr<Instance> *rhs)

{
  char cVar1;
  char cVar2;
  int iVar3;
  element_type *peVar4;
  pointer pcVar5;
  _func_int **pp_Var6;
  int iVar7;
  uint uVar8;
  Context *this_00;
  undefined8 *puVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  string rhs_type;
  string lhs_type;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  float local_88;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  peVar4 = (lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar5 = (peVar4->_type)._M_dataplus._M_p;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar5,pcVar5 + (peVar4->_type)._M_string_length);
  peVar4 = (rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar5 = (peVar4->_type)._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar5,pcVar5 + (peVar4->_type)._M_string_length);
  this_00 = Context::get_instance();
  local_88 = Context::get_float_comparison_tolerance(this_00);
  iVar7 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar7 == 0) {
      bVar11 = (*(byte *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance ^ 1) &
               *(byte *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                         _vptr_Instance;
      goto LAB_00142776;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar7 != 0) goto LAB_0014253c;
    cVar1 = *(char *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                      _vptr_Instance;
    cVar2 = *(char *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                      _vptr_Instance;
    bVar13 = SBORROW1(cVar1,cVar2);
    bVar12 = (char)(cVar1 - cVar2) < '\0';
LAB_00142718:
    bVar11 = bVar13 != bVar12;
    goto LAB_00142776;
  }
LAB_0014253c:
  iVar7 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar7 == 0) {
      iVar3 = *(int *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                       _vptr_Instance;
      iVar7 = *(int *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                       _vptr_Instance;
      bVar13 = SBORROW4(iVar3,iVar7);
      bVar12 = iVar3 - iVar7 < 0;
      goto LAB_00142718;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar7 != 0) goto LAB_00142594;
    fVar14 = (float)*(int *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                             [1]._vptr_Instance;
LAB_00142733:
    fVar14 = fVar14 - *(float *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr[1]._vptr_Instance;
    bVar12 = -local_88 == fVar14;
    bVar13 = -local_88 < fVar14;
LAB_00142772:
    bVar11 = !bVar13 && !bVar12;
LAB_00142776:
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
    return (bool)bVar11;
  }
LAB_00142594:
  iVar7 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar7 == 0) {
      fVar14 = *(float *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance;
      goto LAB_00142733;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar7 == 0) {
      fVar14 = *(float *)&(lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
                          _vptr_Instance -
               (float)*(int *)&(rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1]._vptr_Instance;
      bVar12 = -local_88 == fVar14;
      bVar13 = -local_88 < fVar14;
      goto LAB_00142772;
    }
  }
  iVar7 = std::__cxx11::string::compare((char *)local_a8);
  if (iVar7 == 0) {
    iVar7 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar7 == 0) {
      peVar4 = (lhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_70 = local_60;
      pp_Var6 = peVar4[1]._vptr_Instance;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pp_Var6,
                 (long)&(peVar4[1].super_enable_shared_from_this<Instance>._M_weak_this.
                         super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        _vptr_Instance + (long)pp_Var6);
      peVar4 = (rhs->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pp_Var6 = peVar4[1]._vptr_Instance;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pp_Var6,
                 (long)&(peVar4[1].super_enable_shared_from_this<Instance>._M_weak_this.
                         super___weak_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        _vptr_Instance + (long)pp_Var6);
      uVar10 = local_68;
      if (local_48 < local_68) {
        uVar10 = local_48;
      }
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        uVar8 = memcmp(local_70,local_50,uVar10);
        uVar10 = (ulong)uVar8;
      }
      if ((int)uVar10 == 0) {
        uVar10 = 0xffffffff80000000;
        if (-0x80000000 < (long)(local_68 - local_48)) {
          uVar10 = local_68 - local_48;
        }
        if (0x7ffffffe < (long)uVar10) {
          uVar10 = 0;
        }
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      bVar11 = (byte)(uVar10 >> 0x1f) & 1;
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      goto LAB_00142776;
    }
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = "RuntimeError: cannot compare these two types.";
  __cxa_throw(puVar9,&char_const*::typeinfo,0);
}

Assistant:

bool InstanceIsLessThanComparator::operator()(const std::shared_ptr<Instance>& lhs,
                                              const std::shared_ptr<Instance>& rhs) const {
    const std::string lhs_type = lhs->type();
    const std::string rhs_type = rhs->type();
    float eps = Context::get_instance()->get_float_comparison_tolerance();
    if (lhs_type == "Boolean" && rhs_type == "Boolean")
        return static_cast<const BooleanInstance&>(*lhs).value() < static_cast<const BooleanInstance&>(*rhs).value();
    if (lhs_type == "Character" && rhs_type == "Character")
        return static_cast<const CharacterInstance&>(*lhs).value() <
               static_cast<const CharacterInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Integer")
        return static_cast<const IntegerInstance&>(*lhs).value() < static_cast<const IntegerInstance&>(*rhs).value();
    if (lhs_type == "Integer" && rhs_type == "Float")
        return float(static_cast<const IntegerInstance&>(*lhs).value()) -
               static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Float")
        return static_cast<const FloatInstance&>(*lhs).value() - static_cast<const FloatInstance&>(*rhs).value() < -eps;
    if (lhs_type == "Float" && rhs_type == "Integer")
        return static_cast<const FloatInstance&>(*lhs).value() -
               float(static_cast<const IntegerInstance&>(*rhs).value()) < -eps;
    if (lhs_type == "String" && rhs_type == "String")
        return static_cast<const StringInstance&>(*lhs).value() < static_cast<const StringInstance&>(*rhs).value();
    throw EXC_INVALID_COMPARISON;
}